

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  int iVar2;
  __pid_t _Var3;
  size_t sVar4;
  int *piVar5;
  UnitTestImpl *pUVar6;
  TestRole TVar7;
  char *pcVar8;
  allocator<char> local_135;
  int local_134;
  string local_130;
  int pipe_fd [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  sVar4 = GetThreadCount();
  if (sVar4 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_108,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest-death-test.cc"
                       ,0x450);
    Message::Message((Message *)&local_e8);
    poVar1 = (ostream *)(local_e8._M_dataplus._M_p + 0x10);
    std::operator<<(poVar1,"Death tests use fork(), which is unsafe particularly");
    std::operator<<(poVar1," in a threaded context. For this test, ");
    std::operator<<(poVar1,"Google Test");
    std::operator<<(poVar1," ");
    if (sVar4 == 0) {
      pcVar8 = "couldn\'t detect the number of threads.";
    }
    else {
      std::operator<<(poVar1,"detected ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar8 = " threads.";
    }
    std::operator<<(poVar1,pcVar8);
    std::operator<<(poVar1,
                    " See https://github.com/google/googletest/blob/main/docs/advanced.md#death-tests-and-threads"
                   );
    std::operator<<(poVar1," for more explanation and suggested solutions, especially if");
    std::operator<<(poVar1," this is the last message you see before your test times out.");
    StringStreamToString(&local_130,(stringstream *)local_e8._M_dataplus._M_p);
    if ((stringstream *)local_e8._M_dataplus._M_p != (stringstream *)0x0) {
      (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))(local_e8._M_dataplus._M_p);
    }
    std::operator<<((ostream *)&std::cerr,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    GTestLog::~GTestLog((GTestLog *)&local_108);
  }
  iVar2 = pipe(pipe_fd);
  if (iVar2 != -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"",(allocator<char> *)&local_e8);
    DeathTest::set_last_death_test_message(&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    CaptureStderr();
    FlushInfoLog();
    _Var3 = fork();
    if (_Var3 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"CHECK failed: File ",(allocator<char> *)&local_134);
      std::operator+(&local_88,&local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_68,&local_88,", line ");
      local_48._M_dataplus._M_p._0_4_ = 0x462;
      StreamableToString<int>(&local_c8,(int *)&local_48);
      std::operator+(&local_108,&local_68,&local_c8);
      std::operator+(&local_e8,&local_108,": ");
      std::operator+(&local_130,&local_e8,"child_pid != -1");
      DeathTestAbort(&local_130);
    }
    *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var3;
    if (_Var3 == 0) {
      TVar7 = EXECUTE_TEST;
      while( true ) {
        iVar2 = close(pipe_fd[0]);
        if (iVar2 != -1) break;
        piVar5 = __errno_location();
        if (*piVar5 != 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"CHECK failed: File ",&local_135);
          std::operator+(&local_a8,&local_c8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest-death-test.cc"
                        );
          std::operator+(&local_88,&local_a8,", line ");
          local_134 = 0x465;
          StreamableToString<int>(&local_48,&local_134);
          std::operator+(&local_68,&local_88,&local_48);
          std::operator+(&local_108,&local_68,": ");
          std::operator+(&local_e8,&local_108,"close(pipe_fd[0])");
          std::operator+(&local_130,&local_e8," != -1");
          DeathTestAbort(&local_130);
        }
      }
      (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pipe_fd[1];
      pUVar6 = GetUnitTestImpl();
      ((pUVar6->listeners_).repeater_)->forwarding_enabled_ = false;
      g_in_fast_death_test_child = 1;
    }
    else {
      while( true ) {
        iVar2 = close(pipe_fd[1]);
        if (iVar2 != -1) break;
        piVar5 = __errno_location();
        if (*piVar5 != 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"CHECK failed: File ",&local_135);
          std::operator+(&local_a8,&local_c8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest-death-test.cc"
                        );
          std::operator+(&local_88,&local_a8,", line ");
          local_134 = 0x471;
          StreamableToString<int>(&local_48,&local_134);
          std::operator+(&local_68,&local_88,&local_48);
          std::operator+(&local_108,&local_68,": ");
          std::operator+(&local_e8,&local_108,"close(pipe_fd[1])");
          std::operator+(&local_130,&local_e8," != -1");
          DeathTestAbort(&local_130);
        }
      }
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      TVar7 = OVERSEE_TEST;
    }
    return TVar7;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CHECK failed: File ",(allocator<char> *)&local_134);
  std::operator+(&local_88,&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_68,&local_88,", line ");
  local_48._M_dataplus._M_p._0_4_ = 0x454;
  StreamableToString<int>(&local_c8,(int *)&local_48);
  std::operator+(&local_108,&local_68,&local_c8);
  std::operator+(&local_e8,&local_108,": ");
  std::operator+(&local_130,&local_e8,"pipe(pipe_fd) != -1");
  DeathTestAbort(&local_130);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding(true);
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}